

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Aig_Obj_t *pObj_00;
  uint *puVar10;
  uint uTruth;
  ulong uVar11;
  uint uVar12;
  ushort *puVar13;
  long lVar14;
  int Lits [5];
  uint local_48 [6];
  
  uVar5 = Saig_ManBmcLiteral(p,pObj,iFrame);
  if (uVar5 == 0xffffffff) {
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x423,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
    uVar5 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar7 = uVar5 & 7;
    if (uVar7 == 2) {
      pAVar2 = p->pAig;
      if ((pObj->field_0).CioId < pAVar2->nTruePis) {
        iVar6 = p->nSatVars;
        p->nSatVars = iVar6 + 1;
        uVar5 = iVar6 * 2;
      }
      else {
        if ((pObj->field_0).CioId < pAVar2->nTruePis) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar5 = ((pObj->field_0).CioId - pAVar2->nTruePis) + pAVar2->nTruePos;
        if (((int)uVar5 < 0) || (pAVar2->vCos->nSize <= (int)uVar5)) {
LAB_00565a71:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar5 = Saig_ManBmcCreateCnf_rec(p,(Aig_Obj_t *)pAVar2->vCos->pArray[uVar5],iFrame + -1);
      }
    }
    else if (uVar7 == 3) {
      uVar5 = Saig_ManBmcCreateCnf_rec
                        (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
      uVar5 = *(uint *)&pObj->pFanin0 & 1 ^ uVar5;
    }
    else {
      if ((uVar5 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                      ,0x433,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
      }
      iVar6 = pObj->Id;
      if ((long)iVar6 < 0) {
LAB_00565aed:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vMapping->nSize;
      if (iVar1 <= iVar6) goto LAB_00565aed;
      piVar3 = p->vMapping->pArray;
      uVar5 = piVar3[iVar6];
      if ((ulong)uVar5 == 0) {
        puVar13 = (ushort *)0x0;
      }
      else {
        if (((int)uVar5 < 0) || (iVar1 <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        puVar13 = (ushort *)(piVar3 + uVar5);
      }
      lVar14 = 0;
      do {
        uVar5 = *(uint *)(puVar13 + lVar14 * 2 + 2);
        if ((ulong)uVar5 == 0xffffffff) {
          uVar5 = 0xffffffff;
        }
        else {
          pVVar4 = p->pAig->vObjs;
          if (pVVar4 == (Vec_Ptr_t *)0x0) {
            pObj_00 = (Aig_Obj_t *)0x0;
          }
          else {
            if (((int)uVar5 < 0) || (pVVar4->nSize <= (int)uVar5)) goto LAB_00565a71;
            pObj_00 = (Aig_Obj_t *)pVVar4->pArray[uVar5];
          }
          uVar5 = Saig_ManBmcCreateCnf_rec(p,pObj_00,iFrame);
        }
        local_48[lVar14] = uVar5;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      uVar11 = (ulong)*puVar13;
      puVar10 = &Saig_ManBmcCof1_s_Truth;
      lVar14 = 0;
      do {
        if (local_48[lVar14] == 1) {
          uVar5 = (uint)uVar11 & *puVar10;
          uVar7 = uVar5 >> ((byte)(1 << ((byte)lVar14 & 0x1f)) & 0x1f);
LAB_00565865:
          uVar11 = (ulong)(uVar7 | uVar5) & 0xffff;
          local_48[lVar14] = 0xffffffff;
        }
        else if (local_48[lVar14] == 0) {
          uVar5 = (uint)uVar11 & ~*puVar10;
          uVar7 = uVar5 << ((byte)(1 << ((byte)lVar14 & 0x1f)) & 0x1f);
          goto LAB_00565865;
        }
        lVar14 = lVar14 + 1;
        puVar10 = puVar10 + 1;
      } while (lVar14 != 4);
      uTruth = (uint)uVar11;
      uVar5 = ((uint)(uVar11 >> 4) ^ uTruth) & 0xf0f;
      uVar7 = ((uint)(uVar11 >> 2) ^ uTruth) & 0x3333;
      uVar8 = ((uint)(uVar11 >> 1) ^ uTruth) & 0x5555;
      uVar9 = ((uint)(uVar11 >> 8) ^ uTruth) & 0xff;
      lVar14 = 0;
      do {
        iVar6 = (int)lVar14;
        if (local_48[lVar14] == 0xffffffff) {
          uVar12 = uVar8;
          if (((iVar6 != 0) && (uVar12 = uVar5, iVar6 != 2)) && (uVar12 = uVar7, iVar6 != 1)) {
            uVar12 = uVar9;
          }
          if (uVar12 != 0) {
            __assert_fail("Saig_ManBmcCofEqual(uTruth, v)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                          ,0x3d0,"int Saig_ManBmcReduceTruth(int, int *)");
          }
        }
        else {
          uVar12 = uVar8;
          if (((iVar6 != 0) && (uVar12 = uVar5, iVar6 != 2)) && (uVar12 = uVar7, iVar6 != 1)) {
            uVar12 = uVar9;
          }
          if (uVar12 == 0) {
            local_48[lVar14] = 0xffffffff;
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      if ((uTruth == 0xffff) || (uTruth == 0)) {
        uVar5 = (uint)(uTruth == 0xffff);
      }
      else {
        uVar7 = Dar_CutSortVars(uTruth,(int *)local_48);
        if ((uVar7 == 0xffff) || (uVar7 == 0)) {
          __assert_fail("uTruth != 0 && uTruth != 0xffff",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                        ,0x444,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        if ((uVar7 == 0xaaaa) || (uVar7 == 0x5555)) {
          if ((int)local_48[0] < 0) goto LAB_00565b69;
          uVar5 = local_48[0] ^ uVar7 == 0x5555;
          p->nBufNum = p->nBufNum + 1;
        }
        else {
          local_48[4] = ~uVar7 & 0xffff;
          if ((uVar7 & 1) == 0) {
            local_48[4] = uVar7;
          }
          iVar6 = p->vData->nSize;
          iVar1 = iVar6 / 5;
          if (iVar1 * 5 != iVar6) {
            __assert_fail("iEntry * 5 == Vec_IntSize(p->vData)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                          ,0x450,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
          }
          lVar14 = 0;
          do {
            Vec_IntPush(p->vData,local_48[lVar14]);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 5);
          iVar6 = Hsh_IntManAdd(p->vHash,iVar1);
          if (iVar6 == iVar1) {
            iVar6 = p->nSatVars;
            p->nSatVars = iVar6 + 1;
            uVar5 = iVar6 * 2;
            Saig_ManBmcAddClauses(p,local_48[4],(int *)local_48,uVar5);
            if (iVar1 != p->vId2Lit->nSize) {
              __assert_fail("iEntry == Vec_IntSize(p->vId2Lit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                            ,0x458,"int Saig_ManBmcCreateCnf_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)")
              ;
            }
            Vec_IntPush(p->vId2Lit,uVar5);
            p->nHashMiss = p->nHashMiss + 1;
          }
          else {
            uVar5 = Vec_IntEntry(p->vId2Lit,iVar6);
            piVar3 = &p->vData->nSize;
            *piVar3 = *piVar3 + -5;
            p->nHashHit = p->nHashHit + 1;
          }
          if ((int)uVar5 < 0) {
LAB_00565b69:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar5 = uVar5 ^ uVar7 & 1;
        }
      }
    }
    Saig_ManBmcSetLiteral(p,pObj,iFrame,uVar5);
  }
  return uVar5;
}

Assistant:

int Saig_ManBmcCreateCnf_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    extern unsigned Dar_CutSortVars( unsigned uTruth, int * pVars );
    int * pMapping, i, iLit, Lits[5], uTruth;
    iLit = Saig_ManBmcLiteral( p, pObj, iFrame );
    if ( iLit != ~0 )
        return iLit; 
    assert( iFrame >= 0 );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            iLit = toLit( p->nSatVars++ );
        else
            iLit = Saig_ManBmcCreateCnf_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame-1 );
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        iLit = Saig_ManBmcCreateCnf_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            iLit = lit_neg(iLit);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    assert( Aig_ObjIsNode(pObj) );
    pMapping = Saig_ManBmcMapping( p, pObj );
    for ( i = 0; i < 4; i++ )
        if ( pMapping[i+1] == -1 )
            Lits[i] = -1;
        else
            Lits[i] = Saig_ManBmcCreateCnf_rec( p, Aig_ManObj(p->pAig, pMapping[i+1]), iFrame );
    uTruth = 0xffff & (unsigned)pMapping[0];
    // propagate constants
    uTruth = Saig_ManBmcReduceTruth( uTruth, Lits );
    if ( uTruth == 0 || uTruth == 0xffff )
    {
        iLit = (uTruth == 0xffff);
        return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
    }
    // canonicize inputs
    uTruth = Dar_CutSortVars( uTruth, Lits );
    assert( uTruth != 0 && uTruth != 0xffff );
    if ( uTruth == 0xAAAA || uTruth == 0x5555 )
    {
        iLit = Abc_LitNotCond( Lits[0], uTruth == 0x5555 );
        p->nBufNum++;
    }
    else 
    {
        int iEntry, iRes;
        int fCompl = (uTruth & 1);
        Lits[4] = (uTruth & 1) ? 0xffff & ~uTruth : uTruth;
        iEntry = Vec_IntSize(p->vData) / 5;
        assert( iEntry * 5 == Vec_IntSize(p->vData) );
        for ( i = 0; i < 5; i++ )
            Vec_IntPush( p->vData, Lits[i] );
        iRes = Hsh_IntManAdd( p->vHash, iEntry );
        if ( iRes == iEntry )
        {
            iLit = toLit( p->nSatVars++ );
            Saig_ManBmcAddClauses( p, Lits[4], Lits, iLit );
            assert( iEntry == Vec_IntSize(p->vId2Lit) );
            Vec_IntPush( p->vId2Lit, iLit );
            p->nHashMiss++;
        }
        else
        {
            iLit = Vec_IntEntry( p->vId2Lit, iRes );
            Vec_IntShrink( p->vData, Vec_IntSize(p->vData) - 5 );
            p->nHashHit++;
        }
        iLit = Abc_LitNotCond( iLit, fCompl );
    }
    return Saig_ManBmcSetLiteral( p, pObj, iFrame, iLit );
}